

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int IsMultiplexingPossible(Curl_easy *handle,connectdata *conn)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = 0;
  if (((conn->handler->protocol & 3) != 0) &&
     (iVar2 = 0, (~*(uint *)&(conn->bits).field_0x4 & 0x1001) != 0)) {
    _Var1 = Curl_multiplex_wanted(handle->multi);
    if (_Var1) {
      iVar2 = (uint)(2 < (handle->set).httpversion) * 2;
    }
  }
  return iVar2;
}

Assistant:

static int IsMultiplexingPossible(const struct Curl_easy *handle,
                                  const struct connectdata *conn)
{
  int avail = 0;

  /* If a HTTP protocol and multiplexing is enabled */
  if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
     (!conn->bits.protoconnstart || !conn->bits.close)) {

    if(Curl_multiplex_wanted(handle->multi) &&
       (handle->set.httpversion >= CURL_HTTP_VERSION_2))
      /* allows HTTP/2 */
      avail |= CURLPIPE_MULTIPLEX;
  }
  return avail;
}